

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vp8_dec.c
# Opt level: O0

int ParseResiduals(VP8Decoder *dec,VP8MB *mb,VP8BitReader *token_br)

{
  bool bVar1;
  int iVar2;
  VP8BitReader *in_RDX;
  byte *in_RSI;
  long in_RDI;
  int nz_2;
  int ctx_2;
  int l_1;
  uint32_t nz_coeffs_1;
  int nz_1;
  int ctx_1;
  uint32_t nz_coeffs;
  int l;
  int dc0;
  int i;
  int nz;
  int ctx;
  int16_t dc [16];
  int first;
  uint32_t out_l_nz;
  uint32_t out_t_nz;
  int ch;
  int y;
  int x;
  uint32_t non_zero_uv;
  uint32_t non_zero_y;
  uint8_t lnz;
  uint8_t tnz;
  VP8MB *left_mb;
  int16_t *dst;
  VP8QuantMatrix *q;
  VP8MBData *block;
  VP8BandProbas **ac_proba;
  VP8BandProbas *(*bands) [17];
  undefined1 local_cc;
  uint32_t local_bc;
  uint32_t local_b0;
  int local_a4;
  short local_98 [22];
  int local_6c;
  uint local_68;
  uint local_64;
  int local_60;
  int local_5c;
  int local_58;
  uint local_54;
  uint local_50;
  byte local_4a;
  byte local_49;
  byte *local_48;
  int16_t *local_40;
  int *local_38;
  int16_t *local_30;
  VP8BandProbas **local_28;
  VP8BandProbas **local_20;
  VP8BitReader *local_18;
  byte *local_10;
  
  local_20 = (VP8BandProbas **)(in_RDI + 0x8d0);
  local_40 = (int16_t *)(*(long *)(in_RDI + 0xb60) + (long)*(int *)(in_RDI + 0xb58) * 800);
  local_38 = (int *)(in_RDI + 0x424 + (ulong)*(byte *)(local_40 + 399) * 0x20);
  local_48 = (byte *)(*(long *)(in_RDI + 0xb10) + -2);
  local_50 = 0;
  local_54 = 0;
  local_30 = local_40;
  local_18 = in_RDX;
  local_10 = in_RSI;
  memset(local_40,0,0x300);
  if ((char)local_30[0x180] == '\0') {
    memset(local_98,0,0x20);
    iVar2 = (*GetCoeffs)(local_18,local_20 + 0x11,(uint)local_10[1] + (uint)local_48[1],local_38 + 2
                         ,0,local_98);
    local_48[1] = 0 < iVar2;
    local_10[1] = 0 < iVar2;
    if (iVar2 < 2) {
      for (local_a4 = 0; local_a4 < 0x100; local_a4 = local_a4 + 0x10) {
        local_40[local_a4] = (int16_t)(local_98[0] + 3 >> 3);
      }
    }
    else {
      (*VP8TransformWHT)(local_98,local_40);
    }
    local_6c = 1;
    local_28 = local_20;
  }
  else {
    local_6c = 0;
    local_28 = local_20 + 0x33;
  }
  local_49 = *local_10 & 0xf;
  local_4a = *local_48 & 0xf;
  for (local_5c = 0; local_5c < 4; local_5c = local_5c + 1) {
    bVar1 = (bool)(local_4a & 1);
    local_b0 = 0;
    for (local_58 = 0; local_58 < 4; local_58 = local_58 + 1) {
      iVar2 = (*GetCoeffs)(local_18,local_28,SUB14(bVar1,0) + ((uint)local_49 & 1),local_38,local_6c
                           ,local_40);
      bVar1 = local_6c < iVar2;
      local_49 = (byte)((int)(uint)local_49 >> 1) | bVar1 << 7;
      local_b0 = NzCodeBits(local_b0,iVar2,(uint)(*local_40 != 0));
      local_40 = local_40 + 0x10;
    }
    local_49 = (byte)((int)(uint)local_49 >> 4);
    local_4a = (byte)((int)(uint)local_4a >> 1) | bVar1 << 7;
    local_50 = local_50 << 8 | local_b0;
  }
  local_64 = (uint)local_49;
  local_68 = (int)(uint)local_4a >> 4;
  for (local_60 = 0; local_60 < 4; local_60 = local_60 + 2) {
    local_bc = 0;
    local_49 = (byte)((int)(uint)*local_10 >> ((char)local_60 + 4U & 0x1f));
    local_4a = (byte)((int)(uint)*local_48 >> ((char)local_60 + 4U & 0x1f));
    for (local_5c = 0; local_5c < 2; local_5c = local_5c + 1) {
      bVar1 = (bool)(local_4a & 1);
      for (local_58 = 0; local_58 < 2; local_58 = local_58 + 1) {
        iVar2 = (*GetCoeffs)(local_18,local_20 + 0x22,SUB14(bVar1,0) + ((uint)local_49 & 1),
                             local_38 + 4,0,local_40);
        bVar1 = 0 < iVar2;
        local_49 = (byte)((int)(uint)local_49 >> 1) | bVar1 << 3;
        local_bc = NzCodeBits(local_bc,iVar2,(uint)(*local_40 != 0));
        local_40 = local_40 + 0x10;
      }
      local_49 = (byte)((int)(uint)local_49 >> 2);
      local_4a = (byte)((int)(uint)local_4a >> 1) | bVar1 << 5;
    }
    local_54 = local_bc << ((byte)(local_60 << 2) & 0x1f) | local_54;
    local_64 = ((uint)local_49 << 4) << ((byte)local_60 & 0x1f) | local_64;
    local_68 = (local_4a & 0xf0) << ((byte)local_60 & 0x1f) | local_68;
  }
  *local_10 = (byte)local_64;
  *local_48 = (byte)local_68;
  *(uint *)(local_30 + 0x18a) = local_50;
  *(uint *)(local_30 + 0x18c) = local_54;
  if ((local_54 & 0xaaaa) == 0) {
    local_cc = (undefined1)local_38[7];
  }
  else {
    local_cc = 0;
  }
  *(undefined1 *)(local_30 + 0x18e) = local_cc;
  return (int)(((local_50 != 0 || local_54 != 0) ^ 0xffU) & 1);
}

Assistant:

static int ParseResiduals(VP8Decoder* const dec,
                          VP8MB* const mb, VP8BitReader* const token_br) {
  const VP8BandProbas* (* const bands)[16 + 1] = dec->proba.bands_ptr;
  const VP8BandProbas* const * ac_proba;
  VP8MBData* const block = dec->mb_data + dec->mb_x;
  const VP8QuantMatrix* const q = &dec->dqm[block->segment];
  int16_t* dst = block->coeffs;
  VP8MB* const left_mb = dec->mb_info - 1;
  uint8_t tnz, lnz;
  uint32_t non_zero_y = 0;
  uint32_t non_zero_uv = 0;
  int x, y, ch;
  uint32_t out_t_nz, out_l_nz;
  int first;

  memset(dst, 0, 384 * sizeof(*dst));
  if (!block->is_i4x4) {    // parse DC
    int16_t dc[16] = { 0 };
    const int ctx = mb->nz_dc + left_mb->nz_dc;
    const int nz = GetCoeffs(token_br, bands[1], ctx, q->y2_mat, 0, dc);
    mb->nz_dc = left_mb->nz_dc = (nz > 0);
    if (nz > 1) {   // more than just the DC -> perform the full transform
      VP8TransformWHT(dc, dst);
    } else {        // only DC is non-zero -> inlined simplified transform
      int i;
      const int dc0 = (dc[0] + 3) >> 3;
      for (i = 0; i < 16 * 16; i += 16) dst[i] = dc0;
    }
    first = 1;
    ac_proba = bands[0];
  } else {
    first = 0;
    ac_proba = bands[3];
  }

  tnz = mb->nz & 0x0f;
  lnz = left_mb->nz & 0x0f;
  for (y = 0; y < 4; ++y) {
    int l = lnz & 1;
    uint32_t nz_coeffs = 0;
    for (x = 0; x < 4; ++x) {
      const int ctx = l + (tnz & 1);
      const int nz = GetCoeffs(token_br, ac_proba, ctx, q->y1_mat, first, dst);
      l = (nz > first);
      tnz = (tnz >> 1) | (l << 7);
      nz_coeffs = NzCodeBits(nz_coeffs, nz, dst[0] != 0);
      dst += 16;
    }
    tnz >>= 4;
    lnz = (lnz >> 1) | (l << 7);
    non_zero_y = (non_zero_y << 8) | nz_coeffs;
  }
  out_t_nz = tnz;
  out_l_nz = lnz >> 4;

  for (ch = 0; ch < 4; ch += 2) {
    uint32_t nz_coeffs = 0;
    tnz = mb->nz >> (4 + ch);
    lnz = left_mb->nz >> (4 + ch);
    for (y = 0; y < 2; ++y) {
      int l = lnz & 1;
      for (x = 0; x < 2; ++x) {
        const int ctx = l + (tnz & 1);
        const int nz = GetCoeffs(token_br, bands[2], ctx, q->uv_mat, 0, dst);
        l = (nz > 0);
        tnz = (tnz >> 1) | (l << 3);
        nz_coeffs = NzCodeBits(nz_coeffs, nz, dst[0] != 0);
        dst += 16;
      }
      tnz >>= 2;
      lnz = (lnz >> 1) | (l << 5);
    }
    // Note: we don't really need the per-4x4 details for U/V blocks.
    non_zero_uv |= nz_coeffs << (4 * ch);
    out_t_nz |= (tnz << 4) << ch;
    out_l_nz |= (lnz & 0xf0) << ch;
  }
  mb->nz = out_t_nz;
  left_mb->nz = out_l_nz;

  block->non_zero_y = non_zero_y;
  block->non_zero_uv = non_zero_uv;

  // We look at the mode-code of each block and check if some blocks have less
  // than three non-zero coeffs (code < 2). This is to avoid dithering flat and
  // empty blocks.
  block->dither = (non_zero_uv & 0xaaaa) ? 0 : q->dither;

  return !(non_zero_y | non_zero_uv);  // will be used for further optimization
}